

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O1

int testSpanTestsIteratorMutable(void)

{
  pointer puVar1;
  size_t sVar2;
  uint uVar3;
  reference puVar4;
  ostream *poVar5;
  pointer ptVar6;
  int iVar7;
  size_t index;
  long lVar8;
  bool bVar9;
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  Span<unsigned_int,_18446744073709551615UL> span;
  allocator_type local_59;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Span<unsigned_int,_18446744073709551615UL> local_40;
  
  local_40.m_ptr = (pointer)0x200000001;
  local_40.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_40;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,__l,&local_59);
  puVar1 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40.m_size.m_size =
       (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  ptVar6 = (pointer)0x0;
  lVar8 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  bVar9 = lVar8 == 0;
  local_40.m_ptr = ptVar6;
  if (!bVar9) {
    sVar2 = 0;
    local_40.m_ptr =
         local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    do {
      index = sVar2;
      if (index + 1 != (ulong)puVar1[index]) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x69);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x175);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(i) == (++counter)",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_001e9ffa:
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        break;
      }
      uVar3 = puVar1[index] + 1;
      puVar1[index] = uVar3;
      if (index + 2 != (ulong)uVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x69);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x177);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(i) == (counter + 1)",0x14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        goto LAB_001e9ffa;
      }
      puVar4 = MILBlob::Util::Span<unsigned_int,_18446744073709551615UL>::operator[]
                         (&local_40,index);
      if (*puVar4 != puVar1[index]) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x69);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x178);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(span[counter - 1]) == (i)",0x1a)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        goto LAB_001e9ffa;
      }
      lVar8 = lVar8 + -4;
      bVar9 = lVar8 == 0;
      sVar2 = index + 1;
    } while (!bVar9);
    ptVar6 = (pointer)(index + 1);
  }
  iVar7 = 1;
  if ((bVar9) && (iVar7 = 0, ptVar6 != (pointer)0x4)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(counter) == (size_t(4))",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar7 = 1;
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int testSpanTestsIteratorMutable()
{
    std::vector<uint32_t> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    size_t counter = 0;
    for (auto& i : span) {
        ML_ASSERT_EQ(i, ++counter);
        i++;
        ML_ASSERT_EQ(i, counter + 1);
        ML_ASSERT_EQ(span[counter - 1], i);
    }
    ML_ASSERT_EQ(counter, size_t(4));

    return 0;
}